

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

void __thiscall
H264StreamReader::additionalStreamCheck(H264StreamReader *this,uint8_t *buff,uint8_t *end)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  ostream *poVar10;
  PPSUnit local_500;
  int picOrder;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  uint8_t *puStack_498;
  uint local_490;
  uint local_488;
  uint *local_480;
  uint *puStack_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  bool local_458;
  SliceUnit slice;
  SEIUnit sei;
  SPSUnit tmpsps;
  
  SliceUnit::SliceUnit(&slice);
  SPSUnit::SPSUnit(&tmpsps);
  local_500.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_500.super_NALUnit.bitReader.m_curVal = 0;
  local_500.super_NALUnit.bitReader.m_bitLeft = 0;
  local_500.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_500.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_500.super_NALUnit.m_nalBufferLen = 0;
  local_500.super_NALUnit.nal_unit_type = nuUnspecified;
  local_500.super_NALUnit.nal_ref_idc = 0;
  local_500.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_500.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0024a4a0;
  local_500.pic_parameter_set_id = 0;
  local_500.seq_parameter_set_id = 0;
  local_500.entropy_coding_mode_flag = 1;
  local_500.pic_order_present_flag = 1;
  local_500.m_ready = false;
  sei.m_processedMessages._M_h._M_buckets = &sei.m_processedMessages._M_h._M_single_bucket;
  sei.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  sei.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  sei.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  sei.super_NALUnit.bitReader.m_curVal = 0;
  sei.super_NALUnit.bitReader.m_bitLeft = 0;
  sei.super_NALUnit.nal_unit_type = nuUnspecified;
  sei.super_NALUnit.nal_ref_idc = 0;
  sei.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  sei.super_NALUnit.m_nalBufferLen = 0;
  sei.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0024a4f0;
  sei.pic_struct = '\0';
  sei.m_processedMessages._M_h._M_bucket_count = 1;
  sei.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  sei.m_processedMessages._M_h._M_element_count = 0;
  sei.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&sei.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  sei.number_of_offset_sequences = -1;
  sei.metadataPtsOffset = 0;
  sei.m_mvcHeaderLen = 0;
  sei.m_mvcHeaderStart = (uint8_t *)0x0;
  pbVar8 = NALUnit::findNextNAL(buff,end);
  bVar1 = 0;
  bVar2 = 0;
  bVar3 = false;
  for (; pbVar8 != end; pbVar8 = NALUnit::findNextNAL(pbVar8,end)) {
    switch(*pbVar8 & 0x1f) {
    case 6:
      if (bVar3) {
        puVar9 = NALUnit::findNALWithStartCode(pbVar8,end,true);
        bVar3 = true;
        if (puVar9 != end) {
          NALUnit::decodeBuffer(&sei.super_NALUnit,pbVar8,puVar9);
          uVar5 = (uint)this->orig_vcl_parameters_present_flag;
          if (this->orig_hrd_parameters_present_flag != false) {
            uVar5 = 1;
          }
          SEIUnit::deserialize(&sei,&tmpsps,uVar5);
          bVar4 = SEIUnit::hasProcessedMessage(&sei,0);
          if ((bVar4) || (bVar4 = SEIUnit::hasProcessedMessage(&sei,1), bVar4)) {
            bVar1 = 1;
          }
          if (-1 < sei.number_of_offset_sequences) {
            this->number_of_offset_sequences = sei.number_of_offset_sequences;
          }
        }
      }
      else {
        bVar3 = false;
      }
      break;
    case 8:
      local_488 = 0;
      local_480 = (uint *)0x0;
      puStack_478 = (uint *)0x0;
      local_470._0_4_ = 0;
      local_470._4_4_ = 0;
      local_4a0._0_4_ = nuUnspecified;
      local_4a0._4_4_ = 0;
      puStack_498 = (uint8_t *)0x0;
      local_490 = 0;
      _picOrder = &PTR__NALUnit_0024a4a0;
      local_468._0_4_ = 0;
      local_468._4_4_ = 0;
      uStack_460._0_4_ = 1;
      uStack_460._4_4_ = 1;
      local_458 = false;
      puVar9 = NALUnit::findNALWithStartCode
                         (pbVar8,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
                          true);
      if (local_500.super_NALUnit.m_nalBufferLen == 0) {
        NALUnit::decodeBuffer(&local_500.super_NALUnit,pbVar8,puVar9);
        PPSUnit::deserialize(&local_500);
      }
      NALUnit::decodeBuffer((NALUnit *)&picOrder,pbVar8,puVar9);
      PPSUnit::deserialize((PPSUnit *)&picOrder);
      if ((local_500.pic_parameter_set_id == (uint)local_468) &&
         ((local_490 != local_500.super_NALUnit.m_nalBufferLen ||
          (iVar6 = bcmp(puStack_498,local_500.super_NALUnit.m_nalBuffer,(ulong)local_490),
          iVar6 != 0)))) {
        bVar2 = 1;
      }
      NALUnit::~NALUnit((NALUnit *)&picOrder);
      break;
    case 0xf:
      this->m_mvcSubStream = true;
    case 7:
      puVar9 = NALUnit::findNALWithStartCode
                         (pbVar8,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
                          true);
      NALUnit::decodeBuffer(&tmpsps.super_NALUnit,pbVar8,puVar9);
      SPSUnit::deserialize(&tmpsps);
      this->orig_hrd_parameters_present_flag = tmpsps.nalHrdParams.isPresent;
      this->orig_vcl_parameters_present_flag = tmpsps.vclHrdParams.isPresent;
      bVar3 = true;
    }
  }
  if ((this->super_MPEGStreamReader).m_removePulldown == false) {
    if (this->m_insertSEIMethod == SEI_InsertAuto) {
      bVar3 = (bool)(~bVar1 & 1 |
                    (this->orig_vcl_parameters_present_flag == false ||
                    this->orig_hrd_parameters_present_flag == false));
      this->m_needSeiCorrection = bVar3;
      if ((bVar3 & bVar2) != 1) goto LAB_0019a205;
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "H264 stream contains different PPS with same pps_id. SEI correction is turned off"
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      sLastMsg = true;
    }
    else if (this->m_insertSEIMethod == SEI_InsertForce) goto LAB_0019a19d;
    this->m_needSeiCorrection = false;
  }
  else {
LAB_0019a19d:
    this->m_needSeiCorrection = true;
  }
LAB_0019a205:
  this->m_forceLsbDiv = -1;
  pbVar8 = NALUnit::findNextNAL(buff,end);
  for (; pbVar8 != end; pbVar8 = NALUnit::findNextNAL(pbVar8,end)) {
    uVar5 = *pbVar8 & 0x1f;
    if (uVar5 < 0x15) {
      if ((0x10003eU >> uVar5 & 1) == 0) {
        if ((0x8080U >> uVar5 & 1) == 0) {
          if (uVar5 == 8) {
            processPPS(this,pbVar8);
          }
        }
        else {
          processSPS(this,pbVar8);
        }
      }
      else {
        iVar6 = deserializeSliceHeader(this,&slice,pbVar8,end);
        if ((iVar6 == 0) &&
           ((((slice.sps)->frame_mbs_only_flag == 0 && (iVar6 = 1, slice.m_field_pic_flag != 0)) ||
            (iVar6 = 0, ((byte)slice.pic_order_cnt_lsb & 1) != 0)))) {
          this->m_forceLsbDiv = iVar6;
        }
      }
    }
  }
  if (this->m_forceLsbDiv == -1) {
    this->m_forceLsbDiv = 1;
  }
  pbVar8 = NALUnit::findNextNAL(buff,end);
  iVar6 = -1;
  for (; pbVar8 != end; pbVar8 = NALUnit::findNextNAL(pbVar8,end)) {
    if ((((*pbVar8 & 0x1f) < 0x15) && ((0x10003eU >> (*pbVar8 & 0x1f) & 1) != 0)) &&
       ((iVar7 = deserializeSliceHeader(this,&slice,pbVar8,end),
        iVar7 == 0 && slice.first_mb_in_slice == 0 && ((slice.sps)->pic_order_cnt_type != 2)))) {
      iVar7 = calcPicOrder(this,&slice);
      _picOrder = (undefined **)CONCAT44(uStack_4a4,iVar7);
      bVar3 = SliceUnit::isIDR(&slice);
      bVar4 = SliceUnit::isIFrame(&slice);
      if (bVar4) {
        this->m_fieldFirst = slice.bottom_field_flag;
      }
      iVar6 = iVar6 + 1;
      if (bVar3) {
        iVar6 = 0;
      }
      checkPyramid(this,iVar6,&picOrder,true);
    }
  }
  this->prevPicOrderCntMsb = 0;
  this->prevPicOrderCntLsb = 0;
  SEIUnit::~SEIUnit(&sei);
  NALUnit::~NALUnit(&local_500.super_NALUnit);
  SPSUnit::~SPSUnit(&tmpsps);
  NALUnit::~NALUnit(&slice.super_NALUnit);
  return;
}

Assistant:

void H264StreamReader::additionalStreamCheck(uint8_t *buff, uint8_t *end)
{
    // Make sure that the stream doesn't appear to be progressive, since pic_order_cnt_lsb doesn't reach values higher
    // than 2 in these streams.
    bool SEIFound = false;
    SliceUnit slice;
    SPSUnit tmpsps;

    PPSUnit pps1;
    bool differPPS = false;

    int rez = 0;
    SEIUnit sei;
    uint8_t *nalEnd = nullptr;
    bool tmpspsfound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            tmpsps.decodeBuffer(nal, nalEnd);
            tmpsps.deserialize();
            orig_hrd_parameters_present_flag = tmpsps.nalHrdParams.isPresent;
            orig_vcl_parameters_present_flag = tmpsps.vclHrdParams.isPresent;
            tmpspsfound = true;
            break;
        case NALUnit::NALType::nuPPS:
        {
            PPSUnit pps2;
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            if (pps1.m_nalBufferLen == 0)
            {
                pps1.decodeBuffer(nal, nalEnd);
                pps1.deserialize();
            }
            pps2.decodeBuffer(nal, nalEnd);
            pps2.deserialize();
            if (pps1.pic_parameter_set_id == pps2.pic_parameter_set_id)
            {
                if (pps2.m_nalBufferLen != pps1.m_nalBufferLen ||
                    memcmp(pps2.m_nalBuffer, pps1.m_nalBuffer, pps1.m_nalBufferLen) != 0)
                    differPPS = true;
            }
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (tmpspsfound)
            {
                nalEnd = NALUnit::findNALWithStartCode(nal, end, true);
                if (nalEnd == end)
                    break;
                sei.decodeBuffer(nal, nalEnd);
                sei.deserialize(tmpsps, orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);
                if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
                {
                    SEIFound = true;
                }

                if (sei.number_of_offset_sequences >= 0)
                {
                    number_of_offset_sequences = sei.number_of_offset_sequences;
                }
            }
            break;
        default:
            break;
        }
    }

    if (m_removePulldown || m_insertSEIMethod == SeiMethod::SEI_InsertForce)
        m_needSeiCorrection = true;
    else if (m_insertSEIMethod == SeiMethod::SEI_InsertAuto)
    {
        m_needSeiCorrection =
            orig_hrd_parameters_present_flag == 0 || orig_vcl_parameters_present_flag == 0 || !SEIFound;
        if (m_needSeiCorrection && differPPS)
        {
            LTRACE(LT_INFO, 2, "H264 stream contains different PPS with same pps_id. SEI correction is turned off");
            m_needSeiCorrection = false;
        }
    }
    else
        m_needSeiCorrection = false;

    m_forceLsbDiv = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            break;
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0)
            {
                // coded fields
                if (slice.getSPS()->frame_mbs_only_flag == 0 && slice.m_field_pic_flag)
                    m_forceLsbDiv = 1;
                // coded frames
                else if (slice.pic_order_cnt_lsb % 2 == 1)
                    m_forceLsbDiv = 0;
            }
            break;
        default:
            break;
        }
    }

    if (m_forceLsbDiv == -1)
        m_forceLsbDiv = 1;

    int frameNum = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0 && slice.first_mb_in_slice == 0 && slice.getSPS()->pic_order_cnt_type != 2)
            {
                int picOrder = calcPicOrder(slice);
                if (slice.isIDR())
                    frameNum = -1;
                if (slice.isIFrame())
                    m_fieldFirst = slice.bottom_field_flag;
                checkPyramid(++frameNum, &picOrder, true);
            }
            break;
        default:
            break;
        }
    }
    prevPicOrderCntMsb = prevPicOrderCntLsb = 0;
}